

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  CPpmd7z_RangeDec *rc;
  rar_br *br;
  byte bVar1;
  void *pvVar2;
  rar *rar;
  rar *rar_00;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uchar *puVar10;
  uLong uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  size_t local_38;
  
  pvVar2 = a->format->data;
  if (*(int *)((long)pvVar2 + 0x4f10) == -1) {
    *(undefined4 *)((long)pvVar2 + 0x4f10) = 0;
  }
  if (0 < *(long *)((long)pvVar2 + 0xa0)) {
    __archive_read_consume(a,*(long *)((long)pvVar2 + 0xa0));
    *(undefined8 *)((long)pvVar2 + 0xa0) = 0;
  }
  *buff = (void *)0x0;
  if ((*(char *)((long)pvVar2 + 0xed) != '\0') ||
     (*(long *)((long)pvVar2 + 0x28) <= *(long *)((long)pvVar2 + 200))) {
    *size = 0;
    lVar4 = *(long *)((long)pvVar2 + 0xb8);
    *offset = lVar4;
    lVar12 = *(long *)((long)pvVar2 + 0x28);
    if (*(long *)((long)pvVar2 + 0x28) < lVar4) {
      lVar12 = lVar4;
    }
    *offset = lVar12;
    return 1;
  }
  if (4 < *(byte *)((long)pvVar2 + 0x17) - 0x31) {
    if (*(byte *)((long)pvVar2 + 0x17) == 0x30) {
      pbVar3 = (byte *)a->format->data;
      if ((*(long *)(pbVar3 + 0xa8) == 0) && (((*pbVar3 & 1) == 0 || ((pbVar3[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar3 + 0xb8);
        if (*(long *)(pbVar3 + 8) == *(long *)(pbVar3 + 0xf0)) {
          pbVar3[0xed] = 1;
          return 1;
        }
        pcVar13 = "File CRC error";
      }
      else {
        puVar10 = (uchar *)rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = puVar10;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar4 = *(long *)(pbVar3 + 0xb8);
          *offset = lVar4;
          *(size_t *)(pbVar3 + 0xb8) = lVar4 + local_38;
          *(size_t *)(pbVar3 + 200) = *(long *)(pbVar3 + 200) + local_38;
          *(size_t *)(pbVar3 + 0xa8) = *(long *)(pbVar3 + 0xa8) - local_38;
          *(size_t *)(pbVar3 + 0xa0) = local_38;
          uVar11 = cm_zlib_crc32(*(unsigned_long *)(pbVar3 + 0xf0),puVar10,(uint)local_38);
          *(uLong *)(pbVar3 + 0xf0) = uVar11;
          return 0;
        }
        pcVar13 = "Truncated RAR file data";
      }
    }
    else {
      pcVar13 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar13);
    return -0x1e;
  }
LAB_0036c11b:
  rar = (rar *)a->format->data;
  p = &rar->ppmd7_context;
  rc = &rar->range_dec;
  uVar17 = 0;
  do {
    if (rar->valid == '\0') {
LAB_0036cd88:
      iVar6 = -0x1e;
      goto LAB_0036cd8b;
    }
    if (rar->ppmd_eod != '\0') {
LAB_0036cb90:
      uVar5 = rar->unp_offset;
      if ((ulong)uVar5 != 0) {
        puVar10 = rar->unp_buffer;
        *buff = puVar10;
        *size = (ulong)uVar5;
        lVar4 = rar->offset_outgoing;
        *offset = lVar4;
        rar->offset_outgoing = lVar4 + *size;
        uVar11 = cm_zlib_crc32(rar->crc_calculated,puVar10,(uint)*size);
        rar->crc_calculated = uVar11;
        rar->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc == rar->crc_calculated) {
        rar->entry_eof = '\x01';
        iVar6 = 1;
        goto LAB_0036cd8b;
      }
      pcVar13 = "File CRC error";
LAB_0036cd81:
      archive_set_error(&a->archive,0x54,pcVar13);
      goto LAB_0036cd88;
    }
    if (rar->dictionary_size != 0) {
      if (rar->unp_size <= rar->offset) goto LAB_0036cb90;
      if ((rar->is_ppmd_block != '\0') || (uVar19 = rar->bytes_uncopied, (long)uVar19 < 1))
      goto LAB_0036c19c;
      uVar17 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
      if (uVar19 < uVar17) {
        uVar17 = uVar19;
      }
      uVar5 = copy_from_lzss_window(a,buff,rar->offset,(int)uVar17);
      if (uVar5 == 0) {
        rar->offset = rar->offset + uVar17;
        rar->bytes_uncopied = rar->bytes_uncopied - uVar17;
        puVar10 = (uchar *)*buff;
        if (puVar10 != (uchar *)0x0) {
          rar->unp_offset = 0;
          *size = (ulong)rar->unp_buffer_size;
          lVar4 = rar->offset_outgoing;
          *offset = lVar4;
          rar->offset_outgoing = lVar4 + *size;
          uVar11 = cm_zlib_crc32(rar->crc_calculated,puVar10,(uint)*size);
          rar->crc_calculated = uVar11;
          return 0;
        }
        puVar10 = (uchar *)0x0;
        uVar17 = 0;
        goto LAB_0036ca9b;
      }
LAB_0036cca8:
      uVar17 = (ulong)uVar5;
      goto LAB_0036ccab;
    }
LAB_0036c19c:
    if (((rar->br).next_in == (uchar *)0x0) &&
       (uVar17 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
      puVar10 = (uchar *)rar_read_ahead(a,1,&(rar->br).avail_in);
      (rar->br).next_in = puVar10;
      if (puVar10 == (uchar *)0x0) {
        pcVar13 = "Truncated RAR file data";
        goto LAB_0036cd81;
      }
      if ((rar->br).cache_avail == 0) {
        rar_br_fillup(a,&rar->br);
      }
    }
    if (rar->start_new_table != '\0') {
      uVar5 = parse_codes(a);
      uVar17 = (ulong)uVar5;
      if (-0x15 < (int)uVar5) goto LAB_0036c1c7;
      goto LAB_0036ccab;
    }
LAB_0036c1c7:
    if (rar->is_ppmd_block == '\0') {
      lVar4 = rar->offset;
      lVar12 = (ulong)rar->dictionary_size + lVar4;
      rar->filterstart = 0x7fffffffffffffff;
      rar_00 = (rar *)a->format->data;
      br = &rar_00->br;
      if (rar_00->filterstart < lVar12) {
        lVar12 = rar_00->filterstart;
      }
LAB_0036c315:
      while( true ) {
        if (rar_00->output_last_match != '\0') {
          uVar17 = (rar_00->lzss).position;
          if (lVar12 < (long)(rar_00->lastlength + uVar17)) goto LAB_0036ca33;
          lzss_emit_match(rar_00,rar_00->lastoffset,rar_00->lastlength);
          rar_00->output_last_match = '\0';
        }
        uVar17 = (rar_00->lzss).position;
        if ((rar_00->is_ppmd_block != '\0') || (lVar12 <= (long)uVar17)) goto LAB_0036ca33;
        uVar5 = read_next_symbol(a,&rar_00->maincode);
        if ((int)uVar5 < 0) goto LAB_0036cd88;
        rar_00->output_last_match = '\0';
        if (0xff < uVar5) break;
        lzss_emit_literal(rar_00,(uint8_t)uVar5);
      }
      if (uVar5 != 0x100) {
        if (uVar5 == 0x102) break;
        if (uVar5 == 0x101) goto switchD_0036c228_caseD_3;
        if (0x106 < uVar5) {
          if (uVar5 < 0x10f) {
            bVar16 = *(byte *)((long)&expand_shortbases + (ulong)(uVar5 - 0x107));
            bVar1 = *(byte *)((long)&expand_shortbits + (ulong)(uVar5 - 0x107));
            iVar6 = (rar_00->br).cache_avail;
            if (iVar6 < (int)(uint)bVar1) {
              iVar7 = rar_br_fillup(a,br);
              iVar6 = (rar_00->br).cache_avail;
              if ((iVar7 == 0) && (iVar6 < (int)(uint)bVar1)) goto LAB_0036cd2c;
            }
            uVar17 = (rar_00->br).cache_buffer;
            iVar6 = iVar6 - (uint)bVar1;
            uVar5 = cache_masks[bVar1];
            (rar_00->br).cache_avail = iVar6;
            for (lVar14 = 0; lVar14 != -3; lVar14 = lVar14 + -1) {
              rar_00->oldoffset[lVar14 + 3] = rar_00->oldoffset[lVar14 + 2];
            }
            uVar15 = bVar16 + 1 + (uVar5 & (uint)(uVar17 >> ((byte)iVar6 & 0x3f)));
            rar_00->oldoffset[0] = uVar15;
            uVar5 = 2;
            goto LAB_0036c888;
          }
          if (uVar5 < 300) {
            uVar5 = uVar5 - 0x10f;
            iVar6 = (byte)expand_lengthbases[uVar5] + 3;
            if (7 < uVar5) {
              bVar16 = expand_lengthbits[uVar5];
              iVar7 = (rar_00->br).cache_avail;
              if (iVar7 < (int)(uint)bVar16) {
                iVar18 = rar_br_fillup(a,br);
                iVar7 = (rar_00->br).cache_avail;
                if ((iVar18 == 0) && (iVar7 < (int)(uint)bVar16)) goto LAB_0036cd2c;
              }
              iVar7 = iVar7 - (uint)bVar16;
              iVar6 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar7 & 0x3f)) &
                      cache_masks[bVar16]) + iVar6;
              (rar_00->br).cache_avail = iVar7;
            }
            uVar5 = read_next_symbol(a,&rar_00->offsetcode);
            if (uVar5 < 0x3d) {
              uVar17 = (ulong)uVar5;
              uVar15 = *(int *)(expand_offsetbases + uVar17 * 4) + 1;
              if (3 < uVar5) {
                bVar16 = expand_offsetbits[uVar17];
                if (uVar5 < 10) {
                  iVar7 = (rar_00->br).cache_avail;
                  if (iVar7 < (int)(uint)bVar16) {
                    iVar18 = rar_br_fillup(a,br);
                    iVar7 = (rar_00->br).cache_avail;
                    if ((iVar18 == 0) && (iVar7 < (int)(uint)bVar16)) goto LAB_0036cd2c;
                  }
                  iVar7 = iVar7 - (uint)bVar16;
                  uVar15 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar7 & 0x3f)) &
                           cache_masks[bVar16]) + uVar15;
                  (rar_00->br).cache_avail = iVar7;
                }
                else {
                  if (uVar17 - 0xc < 0x30) {
                    iVar7 = (rar_00->br).cache_avail;
                    iVar18 = bVar16 - 4;
                    if (iVar7 < iVar18) {
                      iVar9 = rar_br_fillup(a,br);
                      iVar7 = (rar_00->br).cache_avail;
                      if ((iVar9 == 0) && (iVar7 < iVar18)) goto LAB_0036cd2c;
                    }
                    uVar15 = ((uint)((rar_00->br).cache_buffer >> ((byte)(iVar7 - iVar18) & 0x3f)) &
                             (&UINT_004959a0)[bVar16]) * 0x10 + uVar15;
                    (rar_00->br).cache_avail = iVar7 - iVar18;
                  }
                  if (rar_00->numlowoffsetrepeats == 0) {
                    uVar5 = read_next_symbol(a,&rar_00->lowoffsetcode);
                    if ((int)uVar5 < 0) goto LAB_0036cd88;
                    if (uVar5 != 0x10) {
                      uVar15 = uVar15 + uVar5;
                      rar_00->lastlowoffset = uVar5;
                      goto LAB_0036c844;
                    }
                    rar_00->numlowoffsetrepeats = 0xf;
                  }
                  else {
                    rar_00->numlowoffsetrepeats = rar_00->numlowoffsetrepeats - 1;
                  }
                  uVar15 = uVar15 + rar_00->lastlowoffset;
                }
              }
LAB_0036c844:
              for (lVar14 = 0; lVar14 != -3; lVar14 = lVar14 + -1) {
                rar_00->oldoffset[lVar14 + 3] = rar_00->oldoffset[lVar14 + 2];
              }
              uVar5 = (uint)(0x1fff < (int)uVar15) + iVar6 + (uint)(0x3ffff < (int)uVar15);
              goto LAB_0036c881;
            }
          }
LAB_0036cd23:
          pcVar13 = "Bad RAR file data";
          goto LAB_0036cd81;
        }
        uVar17 = (ulong)(uVar5 - 0x103);
        uVar15 = rar_00->oldoffset[uVar17];
        uVar8 = read_next_symbol(a,&rar_00->lengthcode);
        if (0x1c < uVar8) goto LAB_0036cd23;
        uVar5 = (byte)expand_lengthbases[uVar8] + 2;
        if (7 < uVar8) {
          bVar16 = expand_lengthbits[uVar8];
          iVar6 = (rar_00->br).cache_avail;
          if (iVar6 < (int)(uint)bVar16) {
            iVar7 = rar_br_fillup(a,br);
            iVar6 = (rar_00->br).cache_avail;
            if ((iVar7 == 0) && (iVar6 < (int)(uint)bVar16)) goto LAB_0036cd2c;
          }
          iVar6 = iVar6 - (uint)bVar16;
          uVar5 = ((uint)((rar_00->br).cache_buffer >> ((byte)iVar6 & 0x3f)) & cache_masks[bVar16])
                  + uVar5;
          (rar_00->br).cache_avail = iVar6;
        }
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          rar_00->oldoffset[uVar17] = rar_00->oldoffset[uVar17 - 1];
        }
LAB_0036c881:
        rar_00->oldoffset[0] = uVar15;
        goto LAB_0036c888;
      }
      iVar6 = (rar_00->br).cache_avail;
      if (iVar6 < 1) {
        iVar7 = rar_br_fillup(a,br);
        iVar6 = (rar_00->br).cache_avail;
        if (iVar6 < 1 && iVar7 == 0) goto LAB_0036cd2c;
      }
      uVar17 = (rar_00->br).cache_buffer;
      uVar5 = iVar6 - 1;
      (rar_00->br).cache_avail = uVar5;
      if ((uVar17 >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        iVar6 = parse_codes(a);
        if (iVar6 != 0) goto LAB_0036cd88;
        goto LAB_0036c315;
      }
      rar_00->start_new_block = '\x01';
      if (iVar6 < 2) {
        iVar6 = rar_br_fillup(a,br);
        uVar5 = (rar_00->br).cache_avail;
        if ((int)uVar5 < 1 && iVar6 == 0) {
LAB_0036cd2c:
          archive_set_error(&a->archive,0x54,"Truncated RAR file data");
          rar_00->valid = '\0';
          goto LAB_0036cd88;
        }
        uVar17 = br->cache_buffer;
      }
      rar_00->start_new_table = (uVar17 >> ((ulong)(uVar5 - 1) & 0x3f) & 1) != 0;
      (rar_00->br).cache_avail = uVar5 - 1;
      uVar17 = (rar_00->lzss).position;
LAB_0036ca33:
      if ((long)uVar17 < 0) goto LAB_0036ccab;
      uVar17 = uVar17 - lVar4;
      rar->bytes_uncopied = uVar17;
      if (uVar17 == 0) {
        pcVar13 = "Internal error extracting RAR file";
        goto LAB_0036cd81;
      }
    }
    else {
      iVar6 = Ppmd7_DecodeSymbol(p,&rc->p);
      if (iVar6 < 0) {
LAB_0036cc57:
        pcVar13 = "Invalid symbol";
        goto LAB_0036cd81;
      }
      if (iVar6 != rar->ppmd_escape) {
switchD_0036c228_caseD_1:
        lzss_emit_literal(rar,(uint8_t)iVar6);
        uVar17 = 1;
        goto LAB_0036c8bf;
      }
      iVar7 = Ppmd7_DecodeSymbol(p,&rc->p);
      if (iVar7 < 0) goto LAB_0036cc57;
      switch(iVar7) {
      case 0:
        goto switchD_0036c228_caseD_0;
      default:
        goto switchD_0036c228_caseD_1;
      case 2:
        rar->ppmd_eod = '\x01';
        goto LAB_0036ca93;
      case 3:
switchD_0036c228_caseD_3:
        archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
        iVar6 = -0x19;
        goto LAB_0036cd8b;
      case 4:
        uVar5 = 0;
        bVar16 = 0x10;
        for (iVar6 = 2; iVar7 = Ppmd7_DecodeSymbol(p,&rc->p), -1 < iVar6; iVar6 = iVar6 + -1) {
          if (iVar7 < 0) goto LAB_0036cbf3;
          uVar5 = uVar5 | iVar7 << (bVar16 & 0x1f);
          bVar16 = bVar16 - 8;
        }
        if (iVar7 < 0) {
LAB_0036cbf3:
          pcVar13 = "Invalid symbol";
          goto LAB_0036cd81;
        }
        uVar17 = (ulong)(iVar7 + 0x20U);
        lzss_emit_match(rar,uVar5 + 2,iVar7 + 0x20U);
        break;
      case 5:
        iVar6 = Ppmd7_DecodeSymbol(p,&rc->p);
        if (iVar6 < 0) goto LAB_0036cc57;
        uVar17 = (ulong)(iVar6 + 4U);
        lzss_emit_match(rar,1,iVar6 + 4U);
      }
LAB_0036c8bf:
      uVar17 = uVar17 + rar->bytes_uncopied;
      rar->bytes_uncopied = uVar17;
    }
    uVar19 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
    if ((long)uVar17 < (long)uVar19) {
      uVar19 = uVar17;
    }
    uVar5 = copy_from_lzss_window(a,buff,rar->offset,(int)uVar19);
    if (uVar5 != 0) goto LAB_0036cca8;
    rar->offset = rar->offset + uVar19;
    rar->bytes_uncopied = rar->bytes_uncopied - uVar19;
    uVar17 = 0;
LAB_0036ca93:
    puVar10 = (uchar *)*buff;
LAB_0036ca9b:
    if (puVar10 != (uchar *)0x0) {
      rar->unp_offset = 0;
      *size = (ulong)rar->unp_buffer_size;
      lVar4 = rar->offset_outgoing;
      *offset = lVar4;
      rar->offset_outgoing = lVar4 + *size;
      uVar11 = cm_zlib_crc32(rar->crc_calculated,puVar10,(uint)*size);
      rar->crc_calculated = uVar11;
LAB_0036ccab:
      iVar6 = (int)uVar17;
      if (iVar6 == -0x14) {
        return -0x14;
      }
      if (iVar6 == 0) {
        return 0;
      }
LAB_0036cd8b:
      Ppmd7_Free((CPpmd7 *)((long)pvVar2 + 0x398));
      return iVar6;
    }
  } while( true );
  uVar5 = rar_00->lastlength;
  if (uVar5 == 0) goto LAB_0036c315;
  uVar15 = rar_00->lastoffset;
LAB_0036c888:
  rar_00->lastoffset = uVar15;
  rar_00->lastlength = uVar5;
  rar_00->output_last_match = '\x01';
  goto LAB_0036c315;
switchD_0036c228_caseD_0:
  rar->start_new_table = '\x01';
  goto LAB_0036c11b;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  *buff = NULL;
  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}